

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

void __thiscall Regex::dumpElement(Regex *this,Element *cur_node,string *dump)

{
  char cVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  string local_1c0 [32];
  stringstream strm;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&strm,_S_out|_S_in);
  switch(cur_node->mType) {
  case TYPE_SEQUENCE:
    pcVar5 = "[S]";
    poVar3 = local_190;
    goto LAB_0011d2ab;
  case TYPE_OR:
    std::operator<<(local_190,"[O]");
    if (cur_node->mRepeatMin == cur_node->mRepeatMax) goto LAB_0011d2b0;
    poVar3 = std::operator<<(local_190,"{");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,cur_node->mRepeatMin);
    poVar3 = std::operator<<(poVar3,",");
    break;
  case TYPE_TERMINAL:
    std::operator<<(local_190,"[T:");
    cVar2 = cur_node->mTermStartChar;
    cVar1 = cur_node->mTermEndChar;
    if (cVar2 == '\0') {
      if (cVar1 == '\0') {
LAB_0011d209:
        poVar3 = std::operator<<(local_190,"0x");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        plVar4 = (long *)std::ostream::operator<<(poVar3,(int)cur_node->mTermStartChar);
        *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) =
             *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      }
      else {
        if (cVar1 != '\x7f') goto LAB_0011d1de;
        std::operator<<(local_190,".");
      }
    }
    else {
      if (cVar2 == cVar1) {
        poVar3 = local_190;
        if (cVar2 < ' ') goto LAB_0011d209;
      }
      else {
LAB_0011d1de:
        poVar3 = std::operator<<(local_190,cVar2);
        poVar3 = std::operator<<(poVar3,"-");
        cVar2 = cur_node->mTermEndChar;
      }
      std::operator<<(poVar3,cVar2);
    }
    std::operator<<(local_190,"]");
    if (cur_node->mRepeatMin == cur_node->mRepeatMax) goto LAB_0011d2b0;
    poVar3 = std::operator<<(local_190,"{");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,cur_node->mRepeatMin);
    poVar3 = std::operator<<(poVar3,",");
    break;
  case TYPE_CLASS:
    pcVar5 = "[C]";
    if (cur_node->mClassInvert != false) {
      pcVar5 = "[C^]";
    }
    std::operator<<(local_190,pcVar5);
    if ((cur_node->mRepeatMin == 1) && (cur_node->mRepeatMax == 1)) goto LAB_0011d2b0;
    poVar3 = std::operator<<(local_190,"{");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,cur_node->mRepeatMin);
    poVar3 = std::operator<<(poVar3,",");
    break;
  default:
    jh_log_print(1,"void Regex::dumpElement(Element *, std::string &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                 ,0x1dc,"Bad element Type");
    goto LAB_0011d2b0;
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cur_node->mRepeatMax);
  pcVar5 = "}";
LAB_0011d2ab:
  std::operator<<(poVar3,pcVar5);
LAB_0011d2b0:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)dump);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  return;
}

Assistant:

void	Regex::dumpElement( Element *cur_node, std::string &dump )
{
	std::stringstream strm( std::stringstream::in | std::stringstream::out );
	
	switch ( cur_node->mType )
	{
		case TYPE_SEQUENCE:
			LOG_INFO( "Seq" );
			strm << "[S]";
			break;
			
		case TYPE_OR:
			LOG_INFO( "Or" );
			strm << "[O]";
			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_TERMINAL:
			LOG_INFO( "Terminal" );
			strm << "[T:";
			if ( cur_node->mTermStartChar == 0 && cur_node->mTermEndChar == 127 )
				strm << ".";
			else if ( cur_node->mTermStartChar == cur_node->mTermEndChar )
			{
				if ( cur_node->mTermStartChar < ' ' )
					strm << "0x" << std::hex << (int)cur_node->mTermStartChar << std::dec;
				else
					strm << cur_node->mTermStartChar;
			}
			else
			{
				strm << cur_node->mTermStartChar << "-" << cur_node->mTermEndChar;
			}
			strm << "]";

			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_CLASS:
			LOG_INFO( "Class" );
			
			if ( cur_node->mClassInvert )
				strm << "[C^]";
			else
				strm << "[C]";
				
			if ( cur_node->mRepeatMin != 1 || cur_node->mRepeatMax != 1 )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;
			
		default:
			LOG_ERR_FATAL( "Bad element Type" );
			break;
	}

	dump.append( strm.str() );
}